

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::free_final_item(final_item *p)

{
  undefined8 *in_RDI;
  v_array<Search::scored_action> *in_stack_fffffffffffffff0;
  
  v_array<Search::scored_action>::delete_v(in_stack_fffffffffffffff0);
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete((void *)*in_RDI);
  }
  if (in_RDI != (undefined8 *)0x0) {
    final_item::~final_item((final_item *)0x3a0b9b);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void free_final_item(final_item* p)
{
  p->prefix->delete_v();
  delete p->prefix;
  delete p;
}